

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsreader.cc
# Opt level: O3

bool fizplex::MPSReader::is_indicator(string *word)

{
  pointer __s1;
  undefined *__n;
  int iVar1;
  undefined **ppuVar2;
  ulong uVar3;
  size_type __rlen;
  bool bVar4;
  
  __s1 = (word->_M_dataplus)._M_p;
  __n = (undefined *)word->_M_string_length;
  bVar4 = true;
  ppuVar2 = &PTR_anon_var_dwarf_1061b9_001c33a8;
  uVar3 = 0;
  do {
    if (__n == ppuVar2[-1]) {
      if (__n == (undefined *)0x0) {
        return bVar4;
      }
      iVar1 = bcmp(__s1,*ppuVar2,(size_t)__n);
      if (iVar1 == 0) {
        return bVar4;
      }
    }
    bVar4 = uVar3 < 3;
    uVar3 = uVar3 + 1;
    ppuVar2 = ppuVar2 + 2;
    if (uVar3 == 4) {
      return bVar4;
    }
  } while( true );
}

Assistant:

bool is_indicator(const std::string &word) {
  for (int i = 0; i < indicator_count; ++i) {
    if (word == indicators[i])
      return true;
  }
  return false;
}